

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGRMiner.cpp
# Opt level: O0

void dgrminer::print_adjacency_lists
               (vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                *adjacency_lists)

{
  size_type sVar1;
  ostream *poVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  reference this;
  reference pvVar9;
  ulong local_48;
  size_t l;
  size_t k_1;
  size_t j_2;
  size_t k;
  size_t j_1;
  size_t j;
  size_t i;
  vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
  *adjacency_lists_local;
  
  j = 0;
  while( true ) {
    sVar1 = std::vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
            ::size(adjacency_lists);
    if (sVar1 <= j) break;
    poVar2 = std::operator<<((ostream *)&std::cout,"ADJ NODES: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,j);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    j_1 = 0;
    while( true ) {
      pvVar3 = std::
               vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>::
               operator[](adjacency_lists,j);
      sVar1 = std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::size
                        (&pvVar3->nodes);
      if (sVar1 <= j_1) break;
      pvVar3 = std::
               vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>::
               operator[](adjacency_lists,j);
      pvVar4 = std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::operator[]
                         (&pvVar3->nodes,j_1);
      pvVar5 = std::array<int,_3UL>::operator[](pvVar4,0);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pvVar5);
      poVar2 = std::operator<<(poVar2,", ");
      pvVar3 = std::
               vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>::
               operator[](adjacency_lists,j);
      pvVar4 = std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::operator[]
                         (&pvVar3->nodes,j_1);
      pvVar5 = std::array<int,_3UL>::operator[](pvVar4,1);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar5);
      poVar2 = std::operator<<(poVar2,", ");
      pvVar3 = std::
               vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>::
               operator[](adjacency_lists,j);
      pvVar4 = std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::operator[]
                         (&pvVar3->nodes,j_1);
      pvVar5 = std::array<int,_3UL>::operator[](pvVar4,2);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar5);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      j_1 = j_1 + 1;
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"ADJ LIST: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,j);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    k = 0;
    while( true ) {
      pvVar3 = std::
               vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>::
               operator[](adjacency_lists,j);
      sVar1 = std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::size(&pvVar3->adjacencyList);
      if (sVar1 <= k) break;
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,k);
      std::operator<<(poVar2,": ");
      j_2 = 0;
      while( true ) {
        pvVar3 = std::
                 vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                 ::operator[](adjacency_lists,j);
        pvVar6 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&pvVar3->adjacencyList,k);
        sVar1 = std::vector<int,_std::allocator<int>_>::size(pvVar6);
        if (sVar1 <= j_2) break;
        pvVar3 = std::
                 vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                 ::operator[](adjacency_lists,j);
        pvVar6 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&pvVar3->adjacencyList,k);
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar6,j_2);
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pvVar7);
        std::operator<<(poVar2," ");
        j_2 = j_2 + 1;
      }
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      k = k + 1;
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"MORE INFO LIST: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,j);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    k_1 = 0;
    while( true ) {
      pvVar3 = std::
               vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>::
               operator[](adjacency_lists,j);
      sVar1 = std::
              vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
              ::size(&pvVar3->adjacencyEdgeInfo);
      if (sVar1 <= k_1) break;
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,k_1);
      poVar2 = std::operator<<(poVar2,": ");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      l = 0;
      while( true ) {
        pvVar3 = std::
                 vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                 ::operator[](adjacency_lists,j);
        pvVar8 = std::
                 vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                 ::operator[](&pvVar3->adjacencyEdgeInfo,k_1);
        sVar1 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::size
                          (pvVar8);
        if (sVar1 <= l) break;
        for (local_48 = 0; local_48 < 8; local_48 = local_48 + 1) {
          pvVar3 = std::
                   vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                   ::operator[](adjacency_lists,j);
          pvVar8 = std::
                   vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                   ::operator[](&pvVar3->adjacencyEdgeInfo,k_1);
          this = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::
                 operator[](pvVar8,l);
          pvVar9 = std::array<int,_8UL>::operator[](this,local_48);
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pvVar9);
          std::operator<<(poVar2,", ");
        }
        std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
        l = l + 1;
      }
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      k_1 = k_1 + 1;
    }
    j = j + 1;
  }
  return;
}

Assistant:

void print_adjacency_lists(std::vector<AdjacencyListCrate> adjacency_lists)
	{
		for (size_t i = 0; i < adjacency_lists.size(); i++)
		{

			cout << "ADJ NODES: " << i << endl;
			for (size_t j = 0; j < adjacency_lists[i].nodes.size(); j++) {
				cout << adjacency_lists[i].nodes[j][ADJ_NODES_ID] << ", "
					 << adjacency_lists[i].nodes[j][ADJ_NODES_CHANGETIME] << ", "
					 << adjacency_lists[i].nodes[j][ADJ_NODES_LABEL] << endl;
			}

			cout << "ADJ LIST: " << i << endl;
			// print adj list:
			for (size_t j = 0; j < adjacency_lists[i].adjacencyList.size(); j++)
			{
				cout << j << ": ";
				for (size_t k = 0; k < adjacency_lists[i].adjacencyList[j].size(); k++)
				{
					cout << adjacency_lists[i].adjacencyList[j][k] << " ";
				}
				cout << endl;
			}

			cout << "MORE INFO LIST: " << i << endl;
			// print more info:
			for (size_t j = 0; j < adjacency_lists[i].adjacencyEdgeInfo.size(); j++)
			{
				cout << j << ": " << endl;;
				for (size_t k = 0; k < adjacency_lists[i].adjacencyEdgeInfo[j].size(); k++)
				{
					for (size_t l = 0; l < ADJ_INFO___SIZE; l++)
					{
						cout << adjacency_lists[i].adjacencyEdgeInfo[j][k][l] << ", ";
					}
					cout << endl;

				}
				cout << endl;
			}
		}
	}